

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O3

adios2_error adios2_variable_min(void *min,adios2_variable *variable)

{
  undefined1 uVar1;
  undefined2 uVar2;
  ulong uVar3;
  undefined8 uVar4;
  int8_t *minT;
  unkbyte10 in_ST0;
  undefined4 uVar5;
  undefined8 in_XMM1_Qa;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  string local_58;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"for adios2_variable, in call to adios2_variable_min","");
  adios2::helper::CheckForNullptr<adios2_variable_const>(variable,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"for void* min, in call to adios2_variable_min","");
  adios2::helper::CheckForNullptr<void>(min,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  switch(*(undefined4 *)(variable + 0x28)) {
  case 1:
    uVar3 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                           &adios2::core::Variable<signed_char>::typeinfo,0);
    uVar1 = adios2::core::Variable<signed_char>::Min(uVar3);
    goto LAB_0012617d;
  case 2:
    uVar3 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                           &adios2::core::Variable<short>::typeinfo,0);
    uVar2 = adios2::core::Variable<short>::Min(uVar3);
    goto LAB_001262d2;
  case 3:
    uVar3 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                           &adios2::core::Variable<int>::typeinfo,0);
    uVar5 = adios2::core::Variable<int>::Min(uVar3);
    goto LAB_00126356;
  case 4:
    uVar3 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                           &adios2::core::Variable<long>::typeinfo,0);
    uVar4 = adios2::core::Variable<long>::Min(uVar3);
    goto LAB_00126274;
  case 5:
    uVar3 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                           &adios2::core::Variable<unsigned_char>::typeinfo,0);
    uVar1 = adios2::core::Variable<unsigned_char>::Min(uVar3);
    goto LAB_0012617d;
  case 6:
    uVar3 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                           &adios2::core::Variable<unsigned_short>::typeinfo,0);
    uVar2 = adios2::core::Variable<unsigned_short>::Min(uVar3);
LAB_001262d2:
    *(undefined2 *)min = uVar2;
    break;
  case 7:
    uVar3 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                           &adios2::core::Variable<unsigned_int>::typeinfo,0);
    uVar5 = adios2::core::Variable<unsigned_int>::Min(uVar3);
LAB_00126356:
    *(undefined4 *)min = uVar5;
    break;
  case 8:
    uVar3 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                           &adios2::core::Variable<unsigned_long>::typeinfo,0);
    uVar4 = adios2::core::Variable<unsigned_long>::Min(uVar3);
LAB_00126274:
    *(undefined8 *)min = uVar4;
    break;
  case 9:
    uVar3 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                           &adios2::core::Variable<float>::typeinfo,0);
    uVar5 = adios2::core::Variable<float>::Min(uVar3);
    *(undefined4 *)min = uVar5;
    break;
  case 10:
    uVar3 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                           &adios2::core::Variable<double>::typeinfo,0);
    uVar4 = adios2::core::Variable<double>::Min(uVar3);
    *(undefined8 *)min = uVar4;
    break;
  case 0xb:
    uVar3 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                           &adios2::core::Variable<long_double>::typeinfo,0);
    adios2::core::Variable<long_double>::Min(uVar3);
    *(unkbyte10 *)min = in_ST0;
    break;
  case 0xc:
    uVar3 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                           &adios2::core::Variable<std::complex<float>>::typeinfo,0);
    uVar4 = adios2::core::Variable<std::complex<float>>::Min(uVar3);
    *(undefined8 *)min = uVar4;
    break;
  case 0xd:
    uVar3 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                           &adios2::core::Variable<std::complex<double>>::typeinfo,0);
    uVar4 = adios2::core::Variable<std::complex<double>>::Min(uVar3);
    *(undefined8 *)min = uVar4;
    *(undefined8 *)((long)min + 8) = in_XMM1_Qa;
    break;
  case 0xe:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<std::__cxx11::string>::typeinfo,0);
    adios2::core::Variable<std::__cxx11::string>::Min((ulong)local_78);
    std::__cxx11::string::operator=((string *)min,(string *)local_78);
    if (local_78[0] != local_68) {
      operator_delete(local_78[0]);
    }
    break;
  case 0xf:
    uVar3 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                           &adios2::core::Variable<char>::typeinfo,0);
    uVar1 = adios2::core::Variable<char>::Min(uVar3);
LAB_0012617d:
    *(undefined1 *)min = uVar1;
  }
  return adios2_error_none;
}

Assistant:

adios2_error adios2_variable_min(void *min, const adios2_variable *variable)
{
    try
    {
        adios2::helper::CheckForNullptr(variable, "for adios2_variable, in call "
                                                  "to adios2_variable_min");
        adios2::helper::CheckForNullptr(min, "for void* min, in call to adios2_variable_min");

        const adios2::core::VariableBase *variableBase =
            reinterpret_cast<const adios2::core::VariableBase *>(variable);
        const adios2::DataType type(variableBase->m_Type);

        if (type == adios2::DataType::Struct)
        {
            // not supported
        }
#define declare_template_instantiation(T)                                                          \
    else if (type == adios2::helper::GetDataType<T>())                                             \
    {                                                                                              \
        T *minT = reinterpret_cast<T *>(min);                                                      \
        const adios2::core::Variable<T> *variableT =                                               \
            dynamic_cast<const adios2::core::Variable<T> *>(variableBase);                         \
        *minT = variableT->Min(adios2::EngineCurrentStep);                                         \
    }
        ADIOS2_FOREACH_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_variable_min"));
    }
}